

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_TOUCH(effect_handler_context_t *context)

{
  object *obj;
  loc finish;
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t dam;
  anon_enum_32 aVar4;
  monster *pmVar5;
  monster *pmVar6;
  loc grid;
  trap *trap;
  anon_union_8_5_62f3dbed_for_which aVar7;
  wchar_t wVar8;
  wchar_t rad;
  source sVar9;
  source origin;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  rad = context->radius + (uint)(context->radius == L'\0');
  if ((context->origin).what != SRC_MONSTER) goto LAB_0013962f;
  pmVar5 = cave_monster(cave,(context->origin).which.grid.x);
  pmVar6 = monster_target_monster((effect_handler_context_t_conflict *)context);
  grid = cave_find_decoy(cave);
  bVar2 = (ulong)grid >> 0x20 == 0;
  if (grid.x == L'\0' || bVar2) {
    if (pmVar6 != (monster *)0x0) {
      sVar9 = source_monster((pmVar5->target).midx);
      aVar7 = sVar9.which;
      wVar8 = context->subtype;
      grid.x = (pmVar6->grid).x;
      grid.y = (pmVar6->grid).y;
      aVar4 = sVar9.what;
      goto LAB_0013960e;
    }
    bVar1 = true;
  }
  else {
    trap = square_trap(cave,grid);
    sVar9 = source_trap(trap);
    aVar7 = sVar9.which;
    wVar8 = context->subtype;
    aVar4 = sVar9.what;
LAB_0013960e:
    bVar1 = false;
    sVar9._4_4_ = 0;
    sVar9.what = aVar4;
    sVar9.which.trap = aVar7.trap;
    bVar2 = project(sVar9,rad,grid,dam,wVar8,L'ô',L'\0','\0',context->obj);
  }
  if (!bVar1) {
    return bVar2;
  }
LAB_0013962f:
  wVar8 = context->subtype;
  obj = context->obj;
  finish.x = (player->grid).x;
  finish.y = (player->grid).y;
  sVar9 = source_player();
  origin._4_4_ = 0;
  origin.what = sVar9.what;
  origin.which.trap = sVar9.which.trap;
  _Var3 = project(origin,rad,finish,dam,wVar8,L'ô',L'\0','\0',obj);
  if (_Var3) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_TOUCH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int rad = context->radius ? context->radius : 1;

	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		struct loc decoy = cave_find_decoy(cave);

		/* Target decoy */
		if (decoy.y && decoy.x) {
			int flg = PROJECT_GRID | PROJECT_KILL | PROJECT_HIDE | PROJECT_ITEM | PROJECT_THRU;
			return (project(source_trap(square_trap(cave, decoy)),
					rad, decoy, dam, context->subtype,flg, 0, 0, context->obj));
		}

		/* Monster cast at monster */
		if (t_mon) {
			int flg = PROJECT_GRID | PROJECT_KILL | PROJECT_HIDE | PROJECT_ITEM | PROJECT_THRU;
			return (project(source_monster(mon->target.midx), rad,
							t_mon->grid, dam, context->subtype,
							flg, 0, 0, context->obj));
		}
	}

	if (project_touch(dam, rad, context->subtype, false, context->obj))
		context->ident = true;
	return true;
}